

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_back_compat_test_common.c
# Opt level: O2

int parse_connection_string
              (IOTHUB_PROVISIONED_DEVICE *device_info,IOTHUB_CLIENT_CONFIG *client_config)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  LOGGER_LOG p_Var6;
  ulong uVar7;
  long lVar8;
  char *__s1;
  size_t sVar9;
  undefined1 auVar10 [16];
  
  __s1 = device_info->connectionString;
  uVar7 = 0;
  iVar2 = 0;
  do {
    if ((((__s1 == (char *)0x0) || (iVar2 != 0)) || (*__s1 == '\0')) || (2 < uVar7)) {
      return iVar2;
    }
    iVar2 = bcmp(__s1,"HostName=",9);
    if (iVar2 == 0) {
      pcVar4 = __s1 + 9;
      lVar8 = 0;
      iVar2 = 0;
      __s1 = pcVar4;
      pcVar5 = pcVar4;
LAB_0011e155:
      if ((iVar2 != 0) || (cVar1 = *__s1, cVar1 == '\0')) goto LAB_0011e36d;
      iVar2 = 0;
      if (cVar1 == '.') {
        if (client_config->iotHubName == (char *)0x0) {
          pcVar3 = (char *)calloc(1,lVar8 + 1);
          client_config->iotHubName = pcVar3;
          if (pcVar3 == (char *)0x0) {
            p_Var6 = xlogging_get_log_function();
            if (p_Var6 != (LOGGER_LOG)0x0) {
              (*p_Var6)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                        ,"parse_connection_string",0xd6,1,"Failure allocating iothub Name");
            }
            cleanup_config_object(client_config);
            iVar2 = 0xd7;
          }
          else {
            memcpy(pcVar3,pcVar5,(long)pcVar4 - (long)pcVar5);
            pcVar5 = __s1 + 1;
            lVar8 = 0;
            iVar2 = 0;
          }
        }
LAB_0011e1f4:
        __s1 = __s1 + 1;
        lVar8 = lVar8 + 1;
        pcVar4 = pcVar4 + 1;
        goto LAB_0011e155;
      }
      if (cVar1 != ';') goto LAB_0011e1f4;
      pcVar3 = (char *)calloc(1,lVar8 + 1);
      client_config->iotHubSuffix = pcVar3;
      if (pcVar3 == (char *)0x0) {
        p_Var6 = xlogging_get_log_function();
        if (p_Var6 != (LOGGER_LOG)0x0) {
          (*p_Var6)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                    ,"parse_connection_string",0xe9,1,"Failure allocating iothub suffix");
        }
        cleanup_config_object(client_config);
        iVar2 = 0xea;
      }
      else {
        memcpy(pcVar3,pcVar5,(long)pcVar4 - (long)pcVar5);
        iVar2 = 0;
      }
LAB_0011e36d:
      uVar7 = uVar7 + 1;
    }
    else {
      iVar2 = bcmp(__s1,"DeviceId=",9);
      if (iVar2 == 0) {
        pcVar5 = __s1 + 9;
        if (client_config->deviceId == (char *)0x0) {
          for (sVar9 = 0; (pcVar5[sVar9] != '\0' && (pcVar5[sVar9] != ';')); sVar9 = sVar9 + 1) {
          }
          pcVar4 = (char *)calloc(1,sVar9 + 1);
          client_config->deviceId = pcVar4;
          __s1 = pcVar5 + sVar9;
          if (pcVar4 == (char *)0x0) {
            p_Var6 = xlogging_get_log_function();
            if (p_Var6 != (LOGGER_LOG)0x0) {
              (*p_Var6)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                        ,"parse_connection_string",0x10a,1,"Failure allocating iothub device id");
            }
            cleanup_config_object(client_config);
            iVar2 = 0x10b;
          }
          else {
            memcpy(pcVar4,pcVar5,sVar9);
            iVar2 = 0;
          }
        }
        else {
          p_Var6 = xlogging_get_log_function();
          iVar2 = 0x117;
          __s1 = pcVar5;
          if (p_Var6 != (LOGGER_LOG)0x0) {
            (*p_Var6)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                      ,"parse_connection_string",0x116,1,
                      "invalid value state.  device previously allocated");
          }
        }
      }
      else {
        auVar10[0] = -(*__s1 == 'S');
        auVar10[1] = -(__s1[1] == 'h');
        auVar10[2] = -(__s1[2] == 'a');
        auVar10[3] = -(__s1[3] == 'r');
        auVar10[4] = -(__s1[4] == 'e');
        auVar10[5] = -(__s1[5] == 'd');
        auVar10[6] = -(__s1[6] == 'A');
        auVar10[7] = -(__s1[7] == 'c');
        auVar10[8] = -(__s1[8] == 'c');
        auVar10[9] = -(__s1[9] == 'e');
        auVar10[10] = -(__s1[10] == 's');
        auVar10[0xb] = -(__s1[0xb] == 's');
        auVar10[0xc] = -(__s1[0xc] == 'K');
        auVar10[0xd] = -(__s1[0xd] == 'e');
        auVar10[0xe] = -(__s1[0xe] == 'y');
        auVar10[0xf] = -(__s1[0xf] == '=');
        iVar2 = 0;
        if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar10[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011e412;
        __s1 = __s1 + 0x10;
        iVar2 = 0;
        if (client_config->deviceKey == (char *)0x0) {
          for (sVar9 = 0; (__s1[sVar9] != '\0' && (__s1[sVar9] != ';')); sVar9 = sVar9 + 1) {
          }
          pcVar5 = (char *)calloc(1,sVar9 + 1);
          client_config->deviceKey = pcVar5;
          if (pcVar5 == (char *)0x0) {
            p_Var6 = xlogging_get_log_function();
            if (p_Var6 != (LOGGER_LOG)0x0) {
              (*p_Var6)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                        ,"parse_connection_string",0x12a,1,"Failure allocating iothub device key");
            }
            cleanup_config_object(client_config);
            iVar2 = 299;
            __s1 = __s1 + sVar9;
          }
          else {
            memcpy(pcVar5,__s1,sVar9);
            __s1 = __s1 + sVar9;
          }
        }
      }
      uVar7 = uVar7 + 1;
    }
LAB_0011e412:
    __s1 = __s1 + 1;
  } while( true );
}

Assistant:

static int parse_connection_string(const IOTHUB_PROVISIONED_DEVICE* device_info, IOTHUB_CLIENT_CONFIG* client_config)
{
    int result = 0;
    size_t tag_index = 0;
    size_t field_cnt = 0;
    size_t counter = 0;
    const char* initial_pos = NULL;
    const char* iterator = device_info->connectionString;
    while (iterator != NULL && *iterator != '\0' && result == 0 && field_cnt < 3)
    {
        if (memcmp(iterator, TEST_HOSTNAME_VALUE, TEST_HOSTNAME_VALUE_LEN) == 0)
        {
            counter = 0;
            iterator += TEST_HOSTNAME_VALUE_LEN;
            initial_pos = iterator;
            // Loop here and break up the hostname into it's parts
            while (*iterator != '\0' && result == 0)
            {
                if (*iterator == '.')
                {
                    if (client_config->iotHubName == NULL)
                    {
                        if ((client_config->iotHubName = (const char*)malloc(counter + 1)) == NULL)
                        {
                            LogError("Failure allocating iothub Name");
                            result = MU_FAILURE;
                            cleanup_config_object(client_config);
                        }
                        else
                        {
                            memset((char*)client_config->iotHubName, 0, counter + 1);
                            memcpy((char*)client_config->iotHubName, initial_pos, iterator - initial_pos);
                            // Change the initial position to the current pos beyond the .
                            initial_pos = iterator+1;
                            counter = 0;
                        }
                    }
                }
                else if (*iterator == ';')
                {
                    // Now get the suffix
                    if ((client_config->iotHubSuffix = (const char*)malloc(counter+1)) == NULL)
                    {
                        LogError("Failure allocating iothub suffix");
                        result = MU_FAILURE;
                        cleanup_config_object(client_config);
                    }
                    else
                    {
                        memset((char*)client_config->iotHubSuffix, 0, counter + 1);
                        memcpy((char*)client_config->iotHubSuffix, initial_pos, iterator - initial_pos);
                        initial_pos = iterator + 1;
                        counter = 0;
                    }
                    break;
                }
                iterator++;
                counter++;
            }
            field_cnt++;
        }
        else if (memcmp(iterator, TEST_DEVICEID_VALUE, TEST_DEVICEID_VALUE_LEN) == 0)
        {
            iterator += TEST_DEVICEID_VALUE_LEN;
            if (client_config->deviceId == NULL)
            {
                counter = 0;
                initial_pos = iterator;
                while (*iterator != '\0' && *iterator != ';')
                {
                    counter++;
                    iterator++;
                }

                if ((client_config->deviceId = (const char*)malloc(counter + 1)) == NULL)
                {
                    LogError("Failure allocating iothub device id");
                    result = MU_FAILURE;
                    cleanup_config_object(client_config);
                }
                else
                {
                    memset((char*)client_config->deviceId, 0, counter + 1);
                    memcpy((char*)client_config->deviceId, initial_pos, counter);
                }
            }
            else
            {
                LogError("invalid value state.  device previously allocated");
                result = MU_FAILURE;
            }
            field_cnt++;
        }
        else if (memcmp(iterator, TEST_SHARED_ACCESS_KEY_VALUE, TEST_SHARED_ACCESS_KEY_LEN) == 0)
        {
            iterator += TEST_SHARED_ACCESS_KEY_LEN;
            if (client_config->deviceKey == NULL)
            {
                counter = 0;
                initial_pos = iterator;
                while (*iterator != '\0' && *iterator != ';')
                {
                    counter++;
                    iterator++;
                }

                if ((client_config->deviceKey = (const char*)malloc(counter + 1)) == NULL)
                {
                    LogError("Failure allocating iothub device key");
                    result = MU_FAILURE;
                    cleanup_config_object(client_config);
                }
                else
                {
                    memset((char*)client_config->deviceKey, 0, counter + 1);
                    memcpy((char*)client_config->deviceKey, initial_pos, counter);
                }
            }
            field_cnt++;
        }
        iterator++;
    }
    return result;
}